

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O1

LogicalType * __thiscall
duckdb::TypeVisitor::VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
          (LogicalType *__return_storage_ptr__,TypeVisitor *this,LogicalType *type,
          anon_class_1_0_00000001 *func)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *__x;
  LogicalType *pLVar4;
  idx_t index;
  uint *func_00;
  LogicalType *extraout_RDX;
  LogicalType *extraout_RDX_00;
  LogicalType *type_00;
  LogicalType *type_01;
  LogicalType *type_02;
  LogicalType *extraout_RDX_01;
  LogicalType *extraout_RDX_02;
  LogicalType *type_03;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  TypeVisitor *pTVar5;
  element_type *peVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  LogicalType value;
  child_list_t<LogicalType> children;
  LogicalType local_f0;
  LogicalType local_d8;
  LogicalType local_c0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  optional_idx local_90;
  LogicalType local_88;
  LogicalType local_70;
  child_list_t<LogicalType> local_58;
  child_list_t<LogicalType> local_40;
  
  func_00 = &switchD_0108166d::switchdataD_013c7be0;
  switch(*this) {
  case (TypeVisitor)0x64:
    __x = &StructType::GetChildTypes_abi_cxx11_((LogicalType *)this)->
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ;
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8,__x);
    if ((element_type *)local_d8._0_8_ !=
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pLVar4 = extraout_RDX;
      pTVar5 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_d8._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                  (&local_f0,pTVar5,pLVar4,(anon_class_1_0_00000001 *)func_00);
        _Var2._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar6 = local_f0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *pTVar5 = (TypeVisitor)local_f0.id_;
        pTVar5[1] = (TypeVisitor)local_f0.physical_type_;
        uVar7 = *(undefined4 *)(pTVar5 + 8);
        uVar9 = *(undefined4 *)(pTVar5 + 0x10);
        *(undefined8 *)(pTVar5 + 8) = 0;
        *(undefined8 *)(pTVar5 + 0x10) = 0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10);
        *(element_type **)(pTVar5 + 8) = peVar6;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10) = _Var2._M_pi;
        uVar8 = *(undefined4 *)(pTVar5 + 0xc);
        uVar10 = *(undefined4 *)(pTVar5 + 0x14);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_a8 = uVar7;
          uStack_a4 = *(undefined4 *)(pTVar5 + 0xc);
          uStack_a0 = uVar9;
          uStack_9c = *(undefined4 *)(pTVar5 + 0x14);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          uVar7 = local_a8;
          uVar8 = uStack_a4;
          uVar9 = uStack_a0;
          uVar10 = uStack_9c;
        }
        _Var2._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uVar8,uVar7);
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = uVar10;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = uVar9;
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
        LogicalType::~LogicalType(&local_f0);
        peVar6 = (element_type *)(pTVar5 + 0x18);
        pLVar4 = extraout_RDX_00;
        pTVar5 = pTVar5 + 0x38;
      } while (peVar6 != local_d8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_40,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8);
    LogicalType::STRUCT(&local_f0,&local_40);
    if (((local_f0.physical_type_ < 0x1e) &&
        ((0x21800000U >> (local_f0.physical_type_ & 0x1f) & 1) != 0)) ||
       (bVar3 = ParquetWriter::TryGetParquetType
                          (&local_f0,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar3)) {
      LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    LogicalType::~LogicalType(&local_f0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_40;
    goto LAB_010819ce;
  case (TypeVisitor)0x65:
    pLVar4 = ListType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar4);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (&local_c0,(TypeVisitor *)&local_d8,type_02,(anon_class_1_0_00000001 *)func_00);
    LogicalType::LIST(&local_f0,&local_c0);
    if (((local_f0.physical_type_ < 0x1e) &&
        ((0x21800000U >> (local_f0.physical_type_ & 0x1f) & 1) != 0)) ||
       (bVar3 = ParquetWriter::TryGetParquetType
                          (&local_f0,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar3)) {
      LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    break;
  case (TypeVisitor)0x66:
    pLVar4 = MapType::KeyType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar4);
    pLVar4 = MapType::ValueType((LogicalType *)this);
    LogicalType::LogicalType(&local_f0,pLVar4);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (&local_70,(TypeVisitor *)&local_d8,type_00,(anon_class_1_0_00000001 *)func_00);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (&local_88,(TypeVisitor *)&local_f0,type_01,(anon_class_1_0_00000001 *)func_00);
    LogicalType::MAP(&local_c0,&local_70,&local_88);
    if (((local_c0.physical_type_ < 0x1e) &&
        ((0x21800000U >> (local_c0.physical_type_ & 0x1f) & 1) != 0)) ||
       (bVar3 = ParquetWriter::TryGetParquetType
                          (&local_c0,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar3)) {
      LogicalType::LogicalType(__return_storage_ptr__,&local_c0);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    LogicalType::~LogicalType(&local_c0);
    LogicalType::~LogicalType(&local_88);
    LogicalType::~LogicalType(&local_70);
    pLVar4 = &local_f0;
    goto LAB_01081a68;
  default:
    if (((0x1d < (byte)this[1]) || ((0x21800000U >> ((byte)this[1] & 0x1f) & 1) == 0)) &&
       (bVar3 = ParquetWriter::TryGetParquetType
                          ((LogicalType *)this,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0),
       !bVar3)) {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
      return __return_storage_ptr__;
    }
    LogicalType::LogicalType(__return_storage_ptr__,(LogicalType *)this);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6b:
    UnionType::CopyMemberTypes_abi_cxx11_
              ((child_list_t<LogicalType> *)&local_d8,(UnionType *)this,type);
    if ((element_type *)local_d8._0_8_ !=
        local_d8.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      pLVar4 = extraout_RDX_01;
      pTVar5 = (TypeVisitor *)
               ((long)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_d8._0_8_ + 0x10))->_M_local_buf + 0x10);
      do {
        VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
                  (&local_f0,pTVar5,pLVar4,(anon_class_1_0_00000001 *)func_00);
        _Var2._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar6 = local_f0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *pTVar5 = (TypeVisitor)local_f0.id_;
        pTVar5[1] = (TypeVisitor)local_f0.physical_type_;
        uVar7 = *(undefined4 *)(pTVar5 + 8);
        uVar9 = *(undefined4 *)(pTVar5 + 0x10);
        *(undefined8 *)(pTVar5 + 8) = 0;
        *(undefined8 *)(pTVar5 + 0x10) = 0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10);
        *(element_type **)(pTVar5 + 8) = peVar6;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pTVar5 + 0x10) = _Var2._M_pi;
        uVar8 = *(undefined4 *)(pTVar5 + 0xc);
        uVar10 = *(undefined4 *)(pTVar5 + 0x14);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_a8 = uVar7;
          uStack_a4 = *(undefined4 *)(pTVar5 + 0xc);
          uStack_a0 = uVar9;
          uStack_9c = *(undefined4 *)(pTVar5 + 0x14);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          uVar7 = local_a8;
          uVar8 = uStack_a4;
          uVar9 = uStack_a0;
          uVar10 = uStack_9c;
        }
        _Var2._M_pi = local_f0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)CONCAT44(uVar8,uVar7);
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = uVar10;
        local_f0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = uVar9;
        if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
        }
        LogicalType::~LogicalType(&local_f0);
        peVar6 = (element_type *)(pTVar5 + 0x18);
        pLVar4 = extraout_RDX_02;
        pTVar5 = pTVar5 + 0x38;
      } while (peVar6 != local_d8.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_58,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_d8);
    LogicalType::UNION(&local_f0,&local_58);
    if (((local_f0.physical_type_ < 0x1e) &&
        ((0x21800000U >> (local_f0.physical_type_ & 0x1f) & 1) != 0)) ||
       (bVar3 = ParquetWriter::TryGetParquetType
                          (&local_f0,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar3)) {
      LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
    LogicalType::~LogicalType(&local_f0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_58;
LAB_010819ce:
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector(this_00);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_d8);
    return __return_storage_ptr__;
  case (TypeVisitor)0x6c:
    pLVar4 = ArrayType::GetChildType((LogicalType *)this);
    LogicalType::LogicalType(&local_d8,pLVar4);
    VisitReplace<duckdb::ParquetWriteSelect(duckdb::CopyToSelectInput&)::__1&>
              (&local_c0,(TypeVisitor *)&local_d8,type_03,(anon_class_1_0_00000001 *)func_00);
    index = ArrayType::GetSize((LogicalType *)this);
    optional_idx::optional_idx(&local_90,index);
    LogicalType::ARRAY(&local_f0,&local_c0,local_90);
    if (((local_f0.physical_type_ < 0x1e) &&
        ((0x21800000U >> (local_f0.physical_type_ & 0x1f) & 1) != 0)) ||
       (bVar3 = ParquetWriter::TryGetParquetType
                          (&local_f0,(optional_ptr<duckdb_parquet::Type::type,_true>)0x0), bVar3)) {
      LogicalType::LogicalType(__return_storage_ptr__,&local_f0);
    }
    else {
      LogicalType::LogicalType(__return_storage_ptr__,VARCHAR);
    }
  }
  LogicalType::~LogicalType(&local_f0);
  pLVar4 = &local_c0;
LAB_01081a68:
  LogicalType::~LogicalType(pLVar4);
  LogicalType::~LogicalType(&local_d8);
  return __return_storage_ptr__;
}

Assistant:

inline LogicalType TypeVisitor::VisitReplace(const LogicalType &type, F &&func) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto children = StructType::GetChildTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::STRUCT(children));
	}
	case LogicalTypeId::UNION: {
		auto children = UnionType::CopyMemberTypes(type);
		for (auto &child : children) {
			child.second = VisitReplace(child.second, func);
		}
		return func(LogicalType::UNION(children));
	}
	case LogicalTypeId::LIST: {
		auto child = ListType::GetChildType(type);
		return func(LogicalType::LIST(VisitReplace(child, func)));
	}
	case LogicalTypeId::ARRAY: {
		auto child = ArrayType::GetChildType(type);
		return func(LogicalType::ARRAY(VisitReplace(child, func), ArrayType::GetSize(type)));
	}
	case LogicalTypeId::MAP: {
		auto key = MapType::KeyType(type);
		auto value = MapType::ValueType(type);
		return func(LogicalType::MAP(VisitReplace(key, func), VisitReplace(value, func)));
	}
	default:
		return func(type);
	}
}